

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

void __thiscall
slang::CommandLine::handlePlusArg
          (CommandLine *this,string_view arg,ParseOptions options,bool *hadUnknowns)

{
  string_view value_00;
  string_view name;
  string_view value_01;
  string_view name_00;
  bool bVar1;
  size_type sVar2;
  pointer ppVar3;
  ulong uVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  aVar5;
  basic_string_view<char,_std::char_traits<char>_> bVar6;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4d8 [2];
  string local_4c8;
  size_t local_4a8;
  size_t local_4a0;
  _Base_ptr local_498;
  size_t local_490;
  undefined1 local_488 [8];
  string result_1;
  size_t local_460;
  size_t local_458;
  char *local_450;
  size_t local_448;
  char *local_440;
  undefined1 local_438 [8];
  string_view curr;
  undefined1 local_408 [8];
  string result;
  char *pcStack_3e0;
  basic_string_view<char> local_3d8;
  string local_3c8;
  Option *local_3a8;
  element_type *option;
  char *pcStack_398;
  basic_string_view<char> local_390;
  string local_380;
  _Self local_360 [3];
  allocator<char> local_341;
  key_type local_340;
  _Self local_320;
  iterator it;
  char *local_310;
  size_t local_308;
  char *local_300;
  size_t idx;
  string_view value;
  bool *hadUnknowns_local;
  CommandLine *this_local;
  undefined1 auStack_2c8 [4];
  ParseOptions options_local;
  string_view arg_local;
  undefined1 local_290 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_280;
  char *local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_270;
  string *local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_260;
  char *pcStack_258;
  string *local_250;
  char *local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_240;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_238;
  undefined1 local_210 [16];
  basic_string_view<char,_std::char_traits<char>_> *local_200;
  char *local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f0;
  string *local_1e8;
  basic_string_view<char,_std::char_traits<char>_> *local_1e0;
  char *pcStack_1d8;
  string *local_1d0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_1c8;
  undefined1 local_1a0 [16];
  basic_string_view<char,_std::char_traits<char>_> *local_190;
  char *local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_180;
  string *local_178;
  basic_string_view<char,_std::char_traits<char>_> *local_170;
  char *pcStack_168;
  string *local_160;
  element_type *local_158;
  char *pcStack_150;
  element_type **local_148;
  basic_string_view<char> *local_140;
  undefined8 local_138;
  char *pcStack_130;
  undefined1 *local_120;
  basic_string_view<char> *local_118;
  char *local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  char *pcStack_f0;
  char **local_e8;
  undefined1 *local_e0;
  char **local_d8;
  char **local_d0;
  undefined8 local_c8;
  undefined1 *local_c0;
  char *local_b8;
  basic_string_view<char,_std::char_traits<char>_> **local_b0;
  basic_string_view<char,_std::char_traits<char>_> **local_90;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_78;
  undefined1 *local_70;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_68;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_60;
  undefined8 local_58;
  undefined1 *local_50;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_48;
  undefined1 *local_40;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_38;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_30;
  undefined8 local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  element_type **local_10;
  
  arg_local._M_len = (size_t)arg._M_str;
  _auStack_2c8 = (_Base_ptr)arg._M_len;
  value._M_str = hadUnknowns;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&idx);
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                    ((basic_string_view<char,_std::char_traits<char>_> *)auStack_2c8,'+',2);
  if (sVar2 != 0xffffffffffffffff) {
    bVar6 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)auStack_2c8,sVar2 + 1,
                       0xffffffffffffffff);
    local_308 = bVar6._M_len;
    idx = local_308;
    local_300 = bVar6._M_str;
    value._M_len = (size_t)local_300;
    _it = std::basic_string_view<char,_std::char_traits<char>_>::substr
                    ((basic_string_view<char,_std::char_traits<char>_> *)auStack_2c8,0,sVar2);
    _auStack_2c8 = it._M_node;
    arg_local._M_len = (size_t)local_310;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_340,(basic_string_view<char,_std::char_traits<char>_> *)auStack_2c8,
             &local_341);
  local_320._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>_>_>_>
       ::find(&this->optionMap,&local_340);
  std::__cxx11::string::~string((string *)&local_340);
  std::allocator<char>::~allocator(&local_341);
  local_360[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>_>_>_>
       ::end(&this->optionMap);
  bVar1 = std::operator==(&local_320,local_360);
  if (bVar1) {
    *value._M_str = '\x01';
    _option = sv("{}: unknown command line argument \'{}\'",0x26);
    local_140 = &local_390;
    local_148 = &option;
    local_158 = option;
    pcStack_150 = pcStack_398;
    ::fmt::v9::basic_string_view<char>::
    basic_string_view<std::basic_string_view<char,_std::char_traits<char>_>,_0>(local_140,_option);
    local_10 = local_148;
    local_178 = &this->programName;
    local_170 = (basic_string_view<char,_std::char_traits<char>_> *)local_390.data_;
    pcStack_168 = (char *)local_390.size_;
    local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_2c8;
    local_b0 = &local_170;
    local_190 = (basic_string_view<char,_std::char_traits<char>_> *)local_390.data_;
    local_188 = (char *)local_390.size_;
    local_160 = &local_380;
    ::fmt::v9::
    make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,std::__cxx11::string&,std::basic_string_view<char,std::char_traits<char>>&>
              (&local_1c8,(v9 *)local_178,local_180,
               (basic_string_view<char,_std::char_traits<char>_> *)local_390.data_);
    local_70 = local_1a0;
    local_58 = 0xdd;
    fmt.size_ = 0xdd;
    fmt.data_ = local_188;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)&local_1c8;
    local_78 = &local_1c8;
    local_68 = &local_1c8;
    local_60 = &local_1c8;
    local_50 = local_70;
    ::fmt::v9::vformat_abi_cxx11_(&local_380,(v9 *)local_190,fmt,args);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->errors,
               &local_380);
    std::__cxx11::string::~string((string *)&local_380);
  }
  else {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>_>_>
             ::operator->(&local_320);
    local_3a8 = std::__shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>::get
                          (&(ppVar3->second).
                            super___shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>
                          );
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&idx);
    this_local._7_1_ = options.ignoreDuplicates;
    if (bVar1) {
      bVar1 = Option::expectsValue(local_3a8);
      if (bVar1) {
        join_0x00000010_0x00000000_ = sv("{}: no value provided for argument \'{}\'",0x27);
        local_118 = &local_3d8;
        local_120 = (undefined1 *)((long)&result.field_2 + 8);
        local_138 = result.field_2._8_8_;
        pcStack_130 = pcStack_3e0;
        ::fmt::v9::basic_string_view<char>::
        basic_string_view<std::basic_string_view<char,_std::char_traits<char>_>,_0>
                  (local_118,join_0x00000010_0x00000000_);
        local_18 = local_120;
        local_1e8 = &this->programName;
        local_1e0 = (basic_string_view<char,_std::char_traits<char>_> *)local_3d8.data_;
        pcStack_1d8 = (char *)local_3d8.size_;
        local_1f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_2c8
        ;
        local_90 = &local_1e0;
        local_200 = (basic_string_view<char,_std::char_traits<char>_> *)local_3d8.data_;
        local_1f8 = (char *)local_3d8.size_;
        local_1d0 = &local_3c8;
        ::fmt::v9::
        make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,std::__cxx11::string&,std::basic_string_view<char,std::char_traits<char>>&>
                  (&local_238,(v9 *)local_1e8,local_1f0,
                   (basic_string_view<char,_std::char_traits<char>_> *)local_3d8.data_);
        local_40 = local_210;
        local_28 = 0xdd;
        fmt_00.size_ = 0xdd;
        fmt_00.data_ = local_1f8;
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)&local_238;
        local_48 = &local_238;
        local_38 = &local_238;
        local_30 = &local_238;
        local_20 = local_40;
        ::fmt::v9::vformat_abi_cxx11_(&local_3c8,(v9 *)local_200,fmt_00,args_00);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->errors,&local_3c8);
        std::__cxx11::string::~string((string *)&local_3c8);
      }
      else {
        curr._M_str = (char *)idx;
        name_00._M_str = (char *)arg_local._M_len;
        name_00._M_len = (size_t)_auStack_2c8;
        value_01._M_str = (char *)value._M_len;
        value_01._M_len = idx;
        Option::set_abi_cxx11_
                  ((string *)local_408,local_3a8,name_00,value_01,(bool)(this_local._7_1_ & 1));
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          assert::assertFailed
                    ("result.empty()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/util/CommandLine.cpp"
                     ,0x240,
                     "void slang::CommandLine::handlePlusArg(string_view, ParseOptions, bool &)");
        }
        std::__cxx11::string::~string((string *)local_408);
      }
    }
    else {
      do {
        local_438 = (undefined1  [8])idx;
        curr._M_len = value._M_len;
        sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                          ((basic_string_view<char,_std::char_traits<char>_> *)&idx,'+',0);
        if (sVar2 == 0xffffffffffffffff) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     ((long)&result_1.field_2 + 8));
          idx = result_1.field_2._8_8_;
          value._M_len = local_460;
        }
        else {
          bVar6 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                            ((basic_string_view<char,_std::char_traits<char>_> *)&idx,sVar2 + 1,
                             0xffffffffffffffff);
          local_448 = bVar6._M_len;
          idx = local_448;
          local_440 = bVar6._M_str;
          value._M_len = (size_t)local_440;
          bVar6 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                            ((basic_string_view<char,_std::char_traits<char>_> *)local_438,0,sVar2);
          local_458 = bVar6._M_len;
          local_438 = (undefined1  [8])local_458;
          local_450 = bVar6._M_str;
          curr._M_len = (size_t)local_450;
        }
        local_498 = _auStack_2c8;
        local_490 = arg_local._M_len;
        local_4a8 = (size_t)local_438;
        local_4a0 = curr._M_len;
        name._M_str = (char *)arg_local._M_len;
        name._M_len = (size_t)_auStack_2c8;
        value_00._M_str = (char *)curr._M_len;
        value_00._M_len = (size_t)local_438;
        aVar5 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
                 )curr._M_len;
        Option::set_abi_cxx11_
                  ((string *)local_488,local_3a8,name,value_00,(bool)(this_local._7_1_ & 1));
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          local_240 = local_4d8;
          local_248 = "{}: {}";
          local_110 = "{}: {}";
          local_4d8[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x6e01f0;
          local_108 = local_240;
          local_278 = (char *)std::char_traits<char>::length("{}: {}");
          local_b8 = local_248;
          local_268 = &this->programName;
          local_250 = &local_4c8;
          local_260 = local_4d8[0];
          local_270 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_488
          ;
          local_100 = &local_260;
          local_280 = local_4d8[0];
          pcStack_258 = local_278;
          local_f8 = local_280;
          pcStack_f0 = local_278;
          ::fmt::v9::
          make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,std::__cxx11::string&,std::__cxx11::string&>
                    ((format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&arg_local._M_str,(v9 *)local_268,local_270,local_4d8[0]);
          local_e0 = local_290;
          local_e8 = &arg_local._M_str;
          local_c8 = 0xdd;
          fmt_01.size_ = 0xdd;
          fmt_01.data_ = local_278;
          args_01.field_1.values_ = aVar5.values_;
          args_01.desc_ = (unsigned_long_long)local_e8;
          local_d8 = local_e8;
          local_d0 = local_e8;
          local_c0 = local_e0;
          ::fmt::v9::vformat_abi_cxx11_(&local_4c8,(v9 *)local_280,fmt_01,args_01);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->errors,&local_4c8);
          std::__cxx11::string::~string((string *)&local_4c8);
        }
        std::__cxx11::string::~string((string *)local_488);
        bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                          ((basic_string_view<char,_std::char_traits<char>_> *)&idx);
      } while (((bVar1 ^ 0xffU) & 1) != 0);
    }
  }
  return;
}

Assistant:

void CommandLine::handlePlusArg(string_view arg, ParseOptions options, bool& hadUnknowns) {
    // Values are plus separated.
    string_view value;
    size_t idx = arg.find_first_of('+', 2);
    if (idx != string_view::npos) {
        value = arg.substr(idx + 1);
        arg = arg.substr(0, idx);
    }

    // TODO: change once we have heterogeneous lookup from C++20
    auto it = optionMap.find(std::string(arg));
    if (it == optionMap.end()) {
        hadUnknowns = true;
        errors.emplace_back(
            fmt::format("{}: unknown command line argument '{}'"sv, programName, arg));
        return;
    }

    auto option = it->second.get();
    if (value.empty()) {
        if (option->expectsValue()) {
            errors.emplace_back(
                fmt::format("{}: no value provided for argument '{}'"sv, programName, arg));
        }
        else {
            std::string result = option->set(arg, value, options.ignoreDuplicates);
            ASSERT(result.empty());
        }
        return;
    }

    do {
        string_view curr = value;
        idx = value.find_first_of('+');
        if (idx != string_view::npos) {
            value = value.substr(idx + 1);
            curr = curr.substr(0, idx);
        }
        else {
            value = {};
        }

        std::string result = option->set(arg, curr, options.ignoreDuplicates);
        if (!result.empty())
            errors.emplace_back(fmt::format("{}: {}", programName, result));

    } while (!value.empty());
}